

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManSetMapRefsOne(Lf_Man_t *p,int iObj)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  Lf_Bst_t *pLVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  undefined8 uVar8;
  Jf_Par_t *pJVar9;
  Lf_Cut_t *pLVar10;
  uint uVar11;
  long lVar12;
  char *__function;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  char *__file;
  char *__assertion;
  float fVar16;
  double dVar17;
  
  if (((iObj < 0) || ((p->vOffsets).nSize <= iObj)) || ((p->vRequired).nSize <= iObj)) {
LAB_0070f083:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = (p->vOffsets).pArray[(uint)iObj];
  if ((iVar2 < 0) || ((p->vMapRefs).nSize <= iVar2)) goto LAB_0070f083;
  if ((p->vMapRefs).pArray[iVar2] < 1) {
    __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5aa,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  pLVar4 = p->pObjBests;
  if ((((uint)pLVar4[iVar2].Cut[0] & 1) != 0) || (((uint)pLVar4[iVar2].Cut[1] & 1) != 0)) {
    __assert_fail("!pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5ab,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  iVar3 = (p->vRequired).pArray[(uint)iObj];
  if (p->pPars->fUseMux7 != 0) {
    pGVar5 = p->pGia;
    if ((((pGVar5->pMuxes != (uint *)0x0) && (pGVar5->pMuxes[(uint)iObj] != 0)) &&
        (pLVar4[iVar2].Delay[2] <= iVar3)) && (pLVar4[iVar2].Flow[2] <= pLVar4[iVar2].Flow[1] * 1.1)
       ) {
      if (pGVar5->nObjs <= iObj) {
LAB_0070f0a2:
        __assertion = "v >= 0 && v < p->nObjs";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_0070f0ed:
        __assert_fail(__assertion,__file,0x1af,__function);
      }
      pGVar6 = pGVar5->pObjs;
      uVar11 = (uint)*(undefined8 *)(pGVar6 + (uint)iObj);
      if ((uVar11 >> 0x1e & 1) == 0) {
        uVar13 = (ulong)(uVar11 & 0x1fffffff);
        if ((((uint)*(ulong *)(pGVar6 + ((uint)iObj - uVar13)) >> 0x1e & 1) == 0) &&
           ((pGVar6[(ulong)(uint)iObj -
                    (ulong)((uint)((ulong)*(undefined8 *)(pGVar6 + (uint)iObj) >> 0x20) & 0x1fffffff
                           )].field_0x3 & 0x40) == 0)) {
          *(ulong *)(pGVar6 + ((uint)iObj - uVar13)) =
               *(ulong *)(pGVar6 + ((uint)iObj - uVar13)) | 0x40000000;
          *(ulong *)(pGVar6 + ((ulong)(uint)iObj -
                              (ulong)(*(uint *)&pGVar6[(uint)iObj].field_0x4 & 0x1fffffff))) =
               *(ulong *)(pGVar6 + ((ulong)(uint)iObj -
                                   (ulong)(*(uint *)&pGVar6[(uint)iObj].field_0x4 & 0x1fffffff))) |
               0x40000000;
          goto LAB_0070eee2;
        }
      }
    }
  }
  if (((uint)pLVar4[iVar2].Cut[1] ^ (uint)pLVar4[iVar2].Cut[0]) < 2) {
    uVar11 = 0;
  }
  else {
    uVar11 = (uint)(pLVar4[iVar2].Delay[1] <= iVar3);
  }
  *(byte *)(pLVar4[iVar2].Cut + uVar11) = *(byte *)(pLVar4[iVar2].Cut + uVar11) | 1;
LAB_0070eee2:
  pLVar10 = Lf_ObjCutBest(p,iObj);
  if (((byte)(*(uint *)&pLVar10->field_0x14 >> 0x17) &
      (*(uint *)&pLVar10->field_0x14 & 0xff000000) != 0x3000000) != 0) {
    __assert_fail("!pCut->fMux7 || pCut->nLeaves == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5b2,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  uVar11 = *(uint *)&pLVar10->field_0x14;
  if (uVar11 < 0x1000000) {
    uVar15 = (ulong)(uVar11 >> 0x18);
  }
  else {
    uVar13 = 0;
    do {
      iVar2 = *(int *)((long)&pLVar10[1].Sign + uVar13 * 4);
      lVar12 = (long)iVar2;
      if ((lVar12 < 0) || ((p->vRequired).nSize <= iVar2)) goto LAB_0070f083;
      piVar7 = (p->vRequired).pArray;
      if (iVar3 <= piVar7[lVar12]) {
        piVar7[lVar12] = iVar3 + -1;
      }
      iVar2 = *(int *)((long)&pLVar10[1].Sign + uVar13 * 4);
      lVar12 = (long)iVar2;
      if ((lVar12 < 0) || (p->pGia->nObjs <= iVar2)) goto LAB_0070f0a2;
      uVar8 = *(undefined8 *)(p->pGia->pObjs + lVar12);
      uVar11 = (uint)uVar8;
      if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) &&
         ((((uint)((ulong)uVar8 >> 0x20) ^ uVar11) & 0x1fffffff) != 0)) {
        if ((p->vOffsets).nSize <= iVar2) goto LAB_0070f083;
        iVar2 = (p->vOffsets).pArray[lVar12];
        if (((long)iVar2 < 0) || ((p->vMapRefs).nSize <= iVar2)) {
          __assertion = "i >= 0 && i < p->nSize";
          __file = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
          ;
          __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
          goto LAB_0070f0ed;
        }
        piVar7 = (p->vMapRefs).pArray + iVar2;
        *piVar7 = *piVar7 + 1;
      }
      uVar13 = uVar13 + 1;
      uVar11 = *(uint *)&pLVar10->field_0x14;
      uVar15 = (ulong)(uVar11 >> 0x18);
    } while (uVar13 < uVar15);
  }
  if ((uVar11 >> 0x17 & 1) == 0) {
    if ((p->vSwitches).nSize != 0) {
      dVar17 = 0.0;
      if (0xffffff < uVar11) {
        fVar16 = 0.0;
        uVar13 = 0;
        do {
          iVar2 = *(int *)((long)&pLVar10[1].Sign + uVar13 * 4);
          if (((long)iVar2 < 0) || ((p->vSwitches).nSize <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          fVar16 = fVar16 + (p->vSwitches).pArray[iVar2];
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
        dVar17 = (double)fVar16;
      }
      p->Switches = dVar17 + p->Switches;
    }
    uVar13 = (ulong)(byte)pLVar10->field_0x17;
    lVar12 = 0xa0;
    lVar14 = 0xa8;
  }
  else {
    lVar12 = 0xa8;
    uVar13 = 1;
    lVar14 = 0xb8;
  }
  pJVar9 = p->pPars;
  plVar1 = (long *)((long)&pJVar9->nLutSize + lVar14);
  *plVar1 = *plVar1 + uVar13;
  plVar1 = (long *)((long)&pJVar9->nLutSize + lVar12);
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

void Lf_ManSetMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Cut_t * pCut;
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    int k, Index, Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( !pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed );
    if ( !p->pPars->fUseMux7 || !Lf_ManSetMuxCut(p, pBest, iObj, Required) )
    {
        Index = (int)(Lf_BestDiffCuts(pBest) && pBest->Delay[1] <= Required);
        pBest->Cut[Index].fUsed = 1;
    }
    pCut = Lf_ObjCutBest( p, iObj );
    assert( !pCut->fMux7 || pCut->nLeaves == 3 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
    {
//        if ( pCut->fMux7 && pCut->pLeaves[k] != Gia_ObjFaninId2(p->pGia, iObj) )
//            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required );
//        else
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, pCut->pLeaves[k])) )
            Lf_ObjMapRefInc( p, pCut->pLeaves[k] );
    }
    if ( pCut->fMux7 )
    {
        p->pPars->Mux7++;
        p->pPars->Edge++;
        return;
    }
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}